

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::fastunpack_16(uint32_t *in,uint32_t *out,uint32_t bit)

{
  logic_error *this;
  undefined4 in_EDX;
  uint32_t *in_RSI;
  uint32_t *in_RDI;
  uint32_t *in_stack_ffffffffffffffb8;
  uint32_t *in_stack_ffffffffffffffc0;
  uint32_t *local_8;
  
  switch(in_EDX) {
  case 0:
    local_8 = nullunpacker16(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case 1:
    local_8 = __fastunpack1_16(in_RDI,in_RSI);
    break;
  case 2:
    local_8 = __fastunpack2_16(in_RDI,in_RSI);
    break;
  case 3:
    local_8 = __fastunpack3_16(in_RDI,in_RSI);
    break;
  case 4:
    local_8 = __fastunpack4_16(in_RDI,in_RSI);
    break;
  case 5:
    local_8 = __fastunpack5_16(in_RDI,in_RSI);
    break;
  case 6:
    local_8 = __fastunpack6_16(in_RDI,in_RSI);
    break;
  case 7:
    local_8 = __fastunpack7_16(in_RDI,in_RSI);
    break;
  case 8:
    local_8 = __fastunpack8_16(in_RDI,in_RSI);
    break;
  case 9:
    local_8 = __fastunpack9_16(in_RDI,in_RSI);
    break;
  case 10:
    local_8 = __fastunpack10_16(in_RDI,in_RSI);
    break;
  case 0xb:
    local_8 = __fastunpack11_16(in_RDI,in_RSI);
    break;
  case 0xc:
    local_8 = __fastunpack12_16(in_RDI,in_RSI);
    break;
  case 0xd:
    local_8 = __fastunpack13_16(in_RDI,in_RSI);
    break;
  case 0xe:
    local_8 = __fastunpack14_16(in_RDI,in_RSI);
    break;
  case 0xf:
    local_8 = __fastunpack15_16(in_RDI,in_RSI);
    break;
  case 0x10:
    local_8 = __fastunpack16_16(in_RDI,in_RSI);
    break;
  case 0x11:
    local_8 = __fastunpack17_16(in_RDI,in_RSI);
    break;
  case 0x12:
    local_8 = __fastunpack18_16(in_RDI,in_RSI);
    break;
  case 0x13:
    local_8 = __fastunpack19_16(in_RDI,in_RSI);
    break;
  case 0x14:
    local_8 = __fastunpack20_16(in_RDI,in_RSI);
    break;
  case 0x15:
    local_8 = __fastunpack21_16(in_RDI,in_RSI);
    break;
  case 0x16:
    local_8 = __fastunpack22_16(in_RDI,in_RSI);
    break;
  case 0x17:
    local_8 = __fastunpack23_16(in_RDI,in_RSI);
    break;
  case 0x18:
    local_8 = __fastunpack24_16(in_RDI,in_RSI);
    break;
  case 0x19:
    local_8 = __fastunpack25_16(in_RDI,in_RSI);
    break;
  case 0x1a:
    local_8 = __fastunpack26_16(in_RDI,in_RSI);
    break;
  case 0x1b:
    local_8 = __fastunpack27_16(in_RDI,in_RSI);
    break;
  case 0x1c:
    local_8 = __fastunpack28_16(in_RDI,in_RSI);
    break;
  case 0x1d:
    local_8 = __fastunpack29_16(in_RDI,in_RSI);
    break;
  case 0x1e:
    local_8 = __fastunpack30_16(in_RDI,in_RSI);
    break;
  case 0x1f:
    local_8 = __fastunpack31_16(in_RDI,in_RSI);
    break;
  case 0x20:
    local_8 = __fastunpack32_16(in_RDI,in_RSI);
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"number of bits is unsupported");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return local_8;
}

Assistant:

const uint32_t *fastunpack_16(const uint32_t *__restrict__ in,
                              uint32_t *__restrict__ out, const uint32_t bit) {
  switch (bit) {
  case 0:
    return nullunpacker16(in, out);

  case 1:
    return __fastunpack1_16(in, out);

  case 2:
    return __fastunpack2_16(in, out);

  case 3:
    return __fastunpack3_16(in, out);

  case 4:
    return __fastunpack4_16(in, out);

  case 5:
    return __fastunpack5_16(in, out);

  case 6:
    return __fastunpack6_16(in, out);

  case 7:
    return __fastunpack7_16(in, out);

  case 8:
    return __fastunpack8_16(in, out);

  case 9:
    return __fastunpack9_16(in, out);

  case 10:
    return __fastunpack10_16(in, out);

  case 11:
    return __fastunpack11_16(in, out);

  case 12:
    return __fastunpack12_16(in, out);

  case 13:
    return __fastunpack13_16(in, out);

  case 14:
    return __fastunpack14_16(in, out);

  case 15:
    return __fastunpack15_16(in, out);

  case 16:
    return __fastunpack16_16(in, out);

  case 17:
    return __fastunpack17_16(in, out);

  case 18:
    return __fastunpack18_16(in, out);

  case 19:
    return __fastunpack19_16(in, out);

  case 20:
    return __fastunpack20_16(in, out);

  case 21:
    return __fastunpack21_16(in, out);

  case 22:
    return __fastunpack22_16(in, out);

  case 23:
    return __fastunpack23_16(in, out);

  case 24:
    return __fastunpack24_16(in, out);

  case 25:
    return __fastunpack25_16(in, out);

  case 26:
    return __fastunpack26_16(in, out);

  case 27:
    return __fastunpack27_16(in, out);

  case 28:
    return __fastunpack28_16(in, out);

  case 29:
    return __fastunpack29_16(in, out);

  case 30:
    return __fastunpack30_16(in, out);

  case 31:
    return __fastunpack31_16(in, out);

  case 32:
    return __fastunpack32_16(in, out);

  default:
    break;
  }
  throw std::logic_error("number of bits is unsupported");
}